

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int has_destructor(symbol *sp,lemon *lemp)

{
  bool local_1d;
  uint local_1c;
  int ret;
  lemon *lemp_local;
  symbol *sp_local;
  
  if (sp->type == TERMINAL) {
    local_1d = lemp->tokendest != (char *)0x0;
  }
  else {
    local_1d = true;
    if (lemp->vardest == (char *)0x0) {
      local_1d = sp->destructor != (char *)0x0;
    }
  }
  local_1c = (uint)local_1d;
  return local_1c;
}

Assistant:

int has_destructor(struct symbol *sp, struct lemon *lemp)
{
  int ret;
  if( sp->type==TERMINAL ){
    ret = lemp->tokendest!=0;
  }else{
    ret = lemp->vardest!=0 || sp->destructor!=0;
  }
  return ret;
}